

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::InvalidateAddressValue(CodeGenGenericContext *this,x86Argument arg)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  x86Reg xVar6;
  long lVar7;
  x86Reg xVar8;
  undefined4 uVar9;
  
  if (arg.type != argPtr) {
    __assert_fail("arg.type == x86Argument::argPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x112,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
  }
  xVar6 = arg.ptrBase ^ rEBX;
  bVar4 = arg.ptrIndex != rNONE;
  bVar5 = xVar6 != rNONE;
  xVar8 = (uint)(arg.field_1.reg != rECX) * 4 + rEDX;
  uVar9 = xVar8;
  if (arg.field_1.reg < rECX) {
    uVar9 = arg.field_1.reg;
  }
  for (lVar7 = 0; lVar7 != 0x220; lVar7 = lVar7 + 0x20) {
    if (*(int *)((long)&this->genReg[0].type + lVar7) == 4) {
      if (*(int *)((long)&this->genReg[0].ptrIndex + lVar7) == 0) {
        iVar1 = *(int *)((long)&this->genReg[0].ptrBase + lVar7);
        if (iVar1 != 0xf) {
          if ((iVar1 != 2 || !bVar4 && !bVar5) &&
             ((arg.ptrIndex != rNONE || xVar6 != rNONE) || iVar1 == 2)) {
            if ((arg.ptrIndex == rNONE) &&
               (*(x86Reg *)((long)&this->genReg[0].ptrBase + lVar7) == arg.ptrBase)) {
              uVar2 = *(uint *)((long)&this->genReg[0].field_1 + lVar7);
              if (uVar2 == 0) {
                __assert_fail("data.ptrSize != sNONE",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                              ,0x128,
                              "void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
              }
              if (arg.field_1.reg == rNONE) {
                __assert_fail("arg.ptrSize != sNONE",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                              ,0x129,
                              "void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
              }
              uVar3 = (uint)(uVar2 != 3) * 4 + 4;
              if (uVar2 < 3) {
                uVar3 = uVar2;
              }
              uVar2 = *(uint *)((long)&this->genReg[0].ptrNum + lVar7);
              if (((uint)(uVar9 + arg.ptrNum) <= uVar2) || (uVar2 + uVar3 <= (uint)arg.ptrNum))
              goto LAB_0027a893;
            }
LAB_0027a883:
            *(undefined4 *)((long)&this->genReg[0].type + lVar7) = 0;
          }
        }
      }
      else if (bVar4 || bVar5) goto LAB_0027a883;
    }
LAB_0027a893:
  }
  lVar7 = 0;
  do {
    if (lVar7 == 0x200) {
      return;
    }
    if (*(int *)((long)&this->xmmReg[0].type + lVar7) == 4) {
      if (*(int *)((long)&this->xmmReg[0].ptrIndex + lVar7) == 0) {
        iVar1 = *(int *)((long)&this->xmmReg[0].ptrBase + lVar7);
        if (iVar1 != 0xf) {
          if ((iVar1 != 2 || !bVar4 && !bVar5) &&
             ((arg.ptrIndex != rNONE || xVar6 != rNONE) || iVar1 == 2)) {
            if ((arg.ptrIndex == rNONE) &&
               (*(x86Reg *)((long)&this->xmmReg[0].ptrBase + lVar7) == arg.ptrBase)) {
              iVar1 = *(int *)((long)&this->xmmReg[0].field_1 + lVar7);
              if (1 < iVar1 - 3U) {
                __assert_fail("data.ptrSize == sDWORD || data.ptrSize == sQWORD",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                              ,0x14a,
                              "void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
              }
              uVar2 = *(uint *)((long)&this->xmmReg[0].ptrNum + lVar7);
              if ((xVar8 + arg.ptrNum <= uVar2) ||
                 (uVar2 + (uint)(iVar1 != 3) * 4 + 4 <= (uint)arg.ptrNum)) goto LAB_0027a953;
            }
LAB_0027a93b:
            *(undefined4 *)((long)&this->xmmReg[0].type + lVar7) = 0;
          }
        }
      }
      else if (arg.ptrIndex != rNONE || xVar6 != rNONE) goto LAB_0027a93b;
    }
LAB_0027a953:
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

void CodeGenGenericContext::InvalidateAddressValue(x86Argument arg)
{
	assert(arg.type == x86Argument::argPtr);

	for(unsigned i = 0; i < rRegCount; i++)
	{
		x86Argument &data = genReg[i];

		if(data.type == x86Argument::argPtr)
		{
			// Can't rewrite constants
			if(data.ptrIndex == rNONE && data.ptrBase == rR14)
				continue;

			// If register contains data from register memory block, no memory update using a different register can overwrite it
			if(data.ptrIndex == rNONE && data.ptrBase == rEBX && (arg.ptrIndex != rNONE || arg.ptrBase != rEBX))
				continue;

			// If register doesn't contain data from a register memory block, register memory update can't overwrite it
			if((data.ptrIndex != rNONE || data.ptrBase != rEBX) && arg.ptrIndex == rNONE && arg.ptrBase == rEBX)
				continue;

			if(data.ptrIndex == rNONE && arg.ptrIndex == rNONE && data.ptrBase == arg.ptrBase)
			{
				assert(data.ptrSize != sNONE);
				assert(arg.ptrSize != sNONE);

				unsigned dataSize = data.ptrSize == sBYTE ? 1 : (data.ptrSize == sWORD ? 2 : (data.ptrSize == sDWORD ? 4 : 8));
				unsigned argSize = arg.ptrSize == sBYTE ? 1 : (arg.ptrSize == sWORD ? 2 : (arg.ptrSize == sDWORD ? 4 : 8));

				if(unsigned(arg.ptrNum) + argSize <= unsigned(data.ptrNum) || unsigned(arg.ptrNum) >= unsigned(data.ptrNum) + dataSize)
					continue;
			}

			data.type = x86Argument::argNone;
		}
	}

	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		x86Argument &data = xmmReg[i];

		if(data.type == x86Argument::argPtr)
		{
			// Can't rewrite constants
			if(data.ptrIndex == rNONE && data.ptrBase == rR14)
				continue;

			// If register contains data from register memory block, no memory update using a different register can overwrite it
			if(data.ptrIndex == rNONE && data.ptrBase == rEBX && (arg.ptrIndex != rNONE || arg.ptrBase != rEBX))
				continue;

			// If register doesn't contain data from a register memory block, register memory update can't overwrite it
			if((data.ptrIndex != rNONE || data.ptrBase != rEBX) && arg.ptrIndex == rNONE && arg.ptrBase == rEBX)
				continue;

			if(data.ptrIndex == rNONE && arg.ptrIndex == rNONE && data.ptrBase == arg.ptrBase)
			{
				assert(data.ptrSize == sDWORD || data.ptrSize == sQWORD);
				assert(data.ptrSize == sDWORD || data.ptrSize == sQWORD);

				unsigned dataSize = data.ptrSize == sDWORD ? 4 : 8;
				unsigned argSize = arg.ptrSize == sDWORD ? 4 : 8;

				if(unsigned(arg.ptrNum) + argSize <= unsigned(data.ptrNum) || unsigned(arg.ptrNum) >= unsigned(data.ptrNum) + dataSize)
					continue;
			}

			data.type = x86Argument::argNone;
		}
	}
}